

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O3

MorphableModel *
eos::morphablemodel::load_model(MorphableModel *__return_storage_ptr__,string *filename)

{
  iterator iVar1;
  runtime_error *this;
  ifstream file;
  uint32_t local_34c;
  undefined1 local_348 [32];
  BinaryInputArchive *local_328;
  _Hashtable<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id,_std::allocator<cereal::traits::detail::base_class_id>,_std::__detail::_Identity,_std::equal_to<cereal::traits::detail::base_class_id>,_cereal::traits::detail::base_class_id_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_320;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<void>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2e8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2b0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_278;
  istream *local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  (__return_storage_ptr__->expression_model).
  super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
  ._M_engaged = false;
  (__return_storage_ptr__->landmark_definitions).
  super__Optional_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  ._M_engaged = false;
  memset(__return_storage_ptr__,0,0xd0);
  (__return_storage_ptr__->texture_coordinates).
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->texture_coordinates).
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->texture_coordinates).
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->texture_triangle_indices).
  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->texture_triangle_indices).
  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->texture_triangle_indices).
  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream((istream *)local_238,(string *)filename,_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_328 = (BinaryInputArchive *)local_348;
    local_348._8_8_ = (pointer)0x0;
    local_348._16_8_ = (pointer)0x0;
    local_348._24_8_ = (pointer)0x0;
    local_320._M_buckets = &local_320._M_single_bucket;
    local_320._M_bucket_count = 1;
    local_320._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_320._M_element_count = 0;
    local_320._M_rehash_policy._M_max_load_factor = 1.0;
    local_320._M_rehash_policy._4_4_ = 0;
    local_2e8._M_buckets = &local_2e8._M_single_bucket;
    local_320._M_rehash_policy._M_next_resize = 0;
    local_320._M_single_bucket = (__node_base_ptr)0x0;
    local_2e8._M_bucket_count = 1;
    local_2e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2e8._M_element_count = 0;
    local_2e8._M_rehash_policy._M_max_load_factor = 1.0;
    local_2e8._M_rehash_policy._4_4_ = 0;
    local_2b0._M_buckets = &local_2b0._M_single_bucket;
    local_2e8._M_rehash_policy._M_next_resize = 0;
    local_2e8._M_single_bucket = (__node_base_ptr)0x0;
    local_2b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2b0._M_element_count = 0;
    local_2b0._M_bucket_count = 1;
    local_2b0._M_rehash_policy._M_max_load_factor = 1.0;
    local_2b0._M_rehash_policy._4_4_ = 0;
    local_278._M_buckets = &local_278._M_single_bucket;
    local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_278._M_element_count = 0;
    local_2b0._M_rehash_policy._M_next_resize = 0;
    local_2b0._M_single_bucket = (__node_base_ptr)0x0;
    local_278._M_bucket_count = 1;
    local_278._M_rehash_policy._M_max_load_factor = 1.0;
    local_278._M_rehash_policy._4_4_ = 0;
    local_278._M_rehash_policy._M_next_resize = 0;
    local_278._M_single_bucket = (__node_base_ptr)0x0;
    local_348._0_8_ = &PTR__InputArchive_001d4c90;
    local_240 = (istream *)local_238;
    if (cereal::InputArchive<cereal::BinaryInputArchive,1u>::
        loadClassVersion<eos::morphablemodel::MorphableModel>()::hash == '\0') {
      load_model();
    }
    iVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&local_278,
                   &cereal::InputArchive<cereal::BinaryInputArchive,1u>::
                    loadClassVersion<eos::morphablemodel::MorphableModel>()::hash);
    if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) {
      cereal::BinaryInputArchive::loadBinary
                ((local_328->super_InputArchive<cereal::BinaryInputArchive,_1U>).self,&local_34c,4);
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long_const&,unsigned_int&>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_278,
                 &cereal::InputArchive<cereal::BinaryInputArchive,1u>::
                  loadClassVersion<eos::morphablemodel::MorphableModel>()::hash,&local_34c);
    }
    else {
      local_34c = *(uint32_t *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>
                          ._M_cur + 0x10);
    }
    MorphableModel::serialize<cereal::BinaryInputArchive>
              (__return_storage_ptr__,local_328,local_34c);
    local_348._0_8_ = &PTR__InputArchive_001d4cf8;
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_278);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_2b0);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<void>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_2e8);
    std::
    _Hashtable<cereal::traits::detail::base_class_id,_cereal::traits::detail::base_class_id,_std::allocator<cereal::traits::detail::base_class_id>,_std::__detail::_Identity,_std::equal_to<cereal::traits::detail::base_class_id>,_cereal::traits::detail::base_class_id_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_320);
    std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
              ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
               (local_348 + 8));
    std::ifstream::~ifstream(local_238);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 "Error opening given file: ",filename);
  std::runtime_error::runtime_error(this,(string *)local_348);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline MorphableModel load_model(std::string filename)
{
    MorphableModel model;

    std::ifstream file(filename, std::ios::binary);
    if (!file)
    {
        throw std::runtime_error("Error opening given file: " + filename);
    }
    cereal::BinaryInputArchive input_archive(file);
    input_archive(model);

    return model;
}